

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O2

void __thiscall
btSimpleBroadphase::btSimpleBroadphase
          (btSimpleBroadphase *this,int maxProxies,btOverlappingPairCache *overlappingPairCache)

{
  btHashedOverlappingPairCache *this_00;
  btSimpleBroadphaseProxy *pbVar1;
  ulong uVar2;
  int iVar3;
  btSimpleBroadphaseProxy *pbVar4;
  ulong uVar5;
  long lVar6;
  
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btSimpleBroadphase_001ec6c8;
  this->m_pairCache = overlappingPairCache;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  if (overlappingPairCache == (btOverlappingPairCache *)0x0) {
    this_00 = (btHashedOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(this_00);
    this->m_pairCache = (btOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  lVar6 = (long)maxProxies;
  pbVar1 = (btSimpleBroadphaseProxy *)btAlignedAllocInternal(lVar6 * 0x40,0x10);
  this->m_pHandlesRawPtr = pbVar1;
  if (maxProxies != 0) {
    pbVar4 = pbVar1;
    do {
      (pbVar4->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
      (pbVar4->super_btBroadphaseProxy).m_multiSapParentProxy = (void *)0x0;
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1 + lVar6);
  }
  this->m_pHandles = pbVar1;
  this->m_maxHandles = maxProxies;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 0;
  this->m_LastHandleIndex = -1;
  uVar2 = 0;
  uVar5 = (ulong)(uint)maxProxies;
  if (maxProxies < 1) {
    uVar5 = uVar2;
  }
  iVar3 = 2;
  for (; uVar5 * 0x40 != uVar2; uVar2 = uVar2 + 0x40) {
    *(int *)((long)(&(pbVar1->super_btBroadphaseProxy).m_aabbMax + 1) + uVar2) = iVar3 + -1;
    *(int *)((long)(pbVar1->super_btBroadphaseProxy).m_aabbMin.m_floats + (uVar2 - 4)) = iVar3;
    iVar3 = iVar3 + 1;
  }
  *(undefined4 *)&pbVar1[lVar6 + -1].super_btBroadphaseProxy.field_0x3c = 0;
  return;
}

Assistant:

btSimpleBroadphase::btSimpleBroadphase(int maxProxies, btOverlappingPairCache* overlappingPairCache)
	:m_pairCache(overlappingPairCache),
	m_ownsPairCache(false),
	m_invalidPair(0)
{

	if (!overlappingPairCache)
	{
		void* mem = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new (mem)btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = btAlignedAlloc(sizeof(btSimpleBroadphaseProxy)*maxProxies,16);
	m_pHandles = new(m_pHandlesRawPtr) btSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;
	

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i+2;//any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	
	}

}